

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Encoding *encoding)

{
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Encoding *local_18;
  Encoding *encoding_local;
  
  local_18 = encoding;
  encoding_local = (Encoding *)__return_storage_ptr__;
  switch(*encoding) {
  case Unknown:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case MFM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MFM",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case FM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FM",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case RX02:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RX02",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case Amiga:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Amiga",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case GCR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GCR",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case Ace:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Ace",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case MX:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MX",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case Agat:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Agat",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case Apple:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Apple",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case Victor:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Victor",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case Vista:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Vista",&local_36);
    std::allocator<char>::~allocator(&local_36);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Encoding& encoding)
{
    switch (encoding)
    {
    case Encoding::MFM:     return "MFM";           break;
    case Encoding::FM:      return "FM";            break;
    case Encoding::RX02:    return "RX02";          break;
    case Encoding::Amiga:   return "Amiga";         break;
    case Encoding::GCR:     return "GCR";           break;
    case Encoding::Ace:     return "Ace";           break;
    case Encoding::MX:      return "MX";            break;
    case Encoding::Agat:    return "Agat";          break;
    case Encoding::Apple:   return "Apple";         break;
    case Encoding::Victor:  return "Victor";        break;
    case Encoding::Vista:   return "Vista";         break;
    case Encoding::Unknown: break;
    }
    return "Unknown";
}